

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

int PHYSFS_mountMemory(void *buf,PHYSFS_uint64 len,_func_void_void_ptr *del,char *fname,
                      char *mountPoint,int appendToPath)

{
  int iVar1;
  PHYSFS_Io *io;
  
  if ((buf == (void *)0x0) || (fname == (char *)0x0)) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    iVar1 = 0;
  }
  else {
    io = __PHYSFS_createMemoryIo(buf,len,del);
    iVar1 = 0;
    if (io != (PHYSFS_Io *)0x0) {
      iVar1 = doMount(io,fname,mountPoint,appendToPath);
      if (iVar1 == 0) {
        *(undefined8 *)((long)io->opaque + 0x28) = 0;
        (*io->destroy)(io);
        iVar1 = 0;
      }
      else {
        iVar1 = 1;
      }
    }
  }
  return iVar1;
}

Assistant:

int PHYSFS_mountMemory(const void *buf, PHYSFS_uint64 len, void (*del)(void *),
                       const char *fname, const char *mountPoint,
                       int appendToPath)
{
    int retval = 0;
    PHYSFS_Io *io = NULL;

    BAIL_IF(!buf, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    io = __PHYSFS_createMemoryIo(buf, len, del);
    BAIL_IF_ERRPASS(!io, 0);
    retval = doMount(io, fname, mountPoint, appendToPath);
    if (!retval)
    {
        /* docs say not to call (del) in case of failure, so cheat. */
        MemoryIoInfo *info = (MemoryIoInfo *) io->opaque;
        info->destruct = NULL;
        io->destroy(io);
    } /* if */

    return retval;
}